

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::parseScaleOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  Replaceable RVar1;
  int32_t textLength;
  UErrorCode UVar2;
  UnicodeString *s;
  StringPiece str;
  UErrorCode conversionStatus;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  CharString buffer;
  UErrorCode local_fc;
  ConstChar16Ptr local_f8;
  char16_t *local_f0;
  UnicodeString local_e0;
  UnicodeString local_a0;
  CharString local_60;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_60.buffer);
  local_60.len = 0;
  *(undefined1 *)&(((Replaceable *)local_60.buffer.ptr)->super_UObject)._vptr_UObject = 0;
  local_fc = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_e0,segment);
  if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_e0.fUnion.fFields.fArray = (char16_t *)((long)&local_e0.fUnion + 2);
    }
  }
  else {
    local_e0.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_f8.p_ = local_e0.fUnion.fFields.fArray;
  textLength = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_a0,'\0',&local_f8,textLength);
  s = &local_a0;
  CharString::appendInvariantChars(&local_60,s,&local_fc);
  UnicodeString::~UnicodeString(&local_a0);
  local_f0 = local_f8.p_;
  UnicodeString::~UnicodeString(&local_e0);
  UVar2 = U_NUMBER_SKELETON_SYNTAX_ERROR;
  if ((local_fc == U_INVARIANT_CONVERSION_ERROR) || (UVar2 = local_fc, U_ZERO_ERROR < local_fc)) {
    *status = UVar2;
  }
  else {
    local_e0.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)UMemory::operator_new((UMemory *)0x60,(size_t)s);
    if (local_e0.super_Replaceable.super_UObject._vptr_UObject == (_func_int **)0x0) {
      local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
    }
    else {
      DecNum::DecNum((DecNum *)local_e0.super_Replaceable.super_UObject._vptr_UObject);
    }
    if ((local_e0.super_Replaceable.super_UObject._vptr_UObject == (_func_int **)0x0) &&
       (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      str.length_ = local_60.len;
      str.ptr_ = local_60.buffer.ptr;
      str._12_4_ = 0;
      DecNum::setTo((DecNum *)local_e0.super_Replaceable.super_UObject._vptr_UObject,str,status);
      RVar1.super_UObject._vptr_UObject = local_e0.super_Replaceable.super_UObject._vptr_UObject;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
        Scale::Scale((Scale *)&local_a0,0,(DecNum *)RVar1.super_UObject._vptr_UObject);
        s = &local_a0;
        Scale::operator=(&macros->scale,(Scale *)&local_a0);
        Scale::~Scale((Scale *)&local_a0);
      }
      else {
        *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        s = (UnicodeString *)local_60.buffer.ptr;
      }
    }
    RVar1.super_UObject._vptr_UObject = (UObject)(UObject)local_e0.super_Replaceable;
    if (local_e0.super_Replaceable.super_UObject._vptr_UObject != (_func_int **)0x0) {
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray
                ((MaybeStackHeaderAndArray<decNumber,_char,_34> *)
                 local_e0.super_Replaceable.super_UObject._vptr_UObject);
      UMemory::operator_delete((UMemory *)RVar1.super_UObject._vptr_UObject,s);
    }
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_60.buffer);
  return;
}

Assistant:

void blueprint_helpers::parseScaleOption(const StringSegment& segment, MacroProps& macros,
                                              UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    LocalPointer<DecNum> decnum(new DecNum(), status);
    if (U_FAILURE(status)) { return; }
    decnum->setTo({buffer.data(), buffer.length()}, status);
    if (U_FAILURE(status)) {
        // This is a skeleton syntax error; don't let the low-level decnum error bubble up
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // NOTE: The constructor will optimize the decnum for us if possible.
    macros.scale = {0, decnum.orphan()};
}